

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

intptr_t __thiscall Inline::TryOptimizeInstrWithFixedDataProperty(Inline *this,Instr **instr)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  SymOpnd *this_00;
  intptr_t iVar4;
  
  uVar2 = Func::GetSourceContextId((*instr)->m_func);
  uVar3 = Func::GetLocalFunctionId((*instr)->m_func);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,UseFixedDataPropsPhase,uVar2,uVar3);
  if (!bVar1) {
    uVar2 = Func::GetSourceContextId((*instr)->m_func);
    uVar3 = Func::GetLocalFunctionId((*instr)->m_func);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01441eb0,UseFixedDataPropsInInlinerPhase,uVar2,uVar3);
    if ((!bVar1) && ((*instr)->m_kind == InstrKindProfiled)) {
      bVar1 = IR::Opnd::IsSymOpnd((*instr)->m_src1);
      if (bVar1) {
        this_00 = IR::Opnd::AsSymOpnd((*instr)->m_src1);
        bVar1 = IR::SymOpnd::IsPropertySymOpnd(this_00);
        if (bVar1) {
          bVar1 = OpCodeAttr::CanLoadFixedFields((*instr)->m_opcode);
          if (bVar1) {
            iVar4 = IR::Instr::TryOptimizeInstrWithFixedDataProperty(*instr,instr,(GlobOpt *)0x0);
            return iVar4;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

intptr_t
Inline::TryOptimizeInstrWithFixedDataProperty(IR::Instr *&instr)
{
    if (PHASE_OFF(Js::UseFixedDataPropsPhase, instr->m_func) ||
        PHASE_OFF(Js::UseFixedDataPropsInInlinerPhase, instr->m_func))
    {
        return 0;
    }
    if (!instr->IsProfiledInstr() ||
        !instr->GetSrc1()->IsSymOpnd() || !instr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
    {
        return 0;
    }
    if (!OpCodeAttr::CanLoadFixedFields(instr->m_opcode))
    {
        return 0;
    }
    return instr->TryOptimizeInstrWithFixedDataProperty(&instr, nullptr);
}